

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

DVector3 * __thiscall
AActor::GetPortalTransition
          (DVector3 *__return_storage_ptr__,AActor *this,double byoffset,sector_t **pSec)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  subsector_t *psVar5;
  sector_t_conflict *psVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_58;
  double local_50;
  double local_48;
  
  psVar6 = (sector_t_conflict *)this->Sector;
  dVar9 = (this->__Pos).X;
  dVar11 = (this->__Pos).Z;
  dVar8 = byoffset + dVar11;
  __return_storage_ptr__->X = dVar9;
  dVar10 = (this->__Pos).Y;
  __return_storage_ptr__->Y = dVar10;
  __return_storage_ptr__->Z = dVar11;
  if ((psVar6->planes[1].Flags & 0x1d0U) == 0x100) {
    uVar7 = (ulong)psVar6->Portals[1];
    bVar2 = sectorPortals.Array[uVar7].mPlaneZ <= dVar8;
    bVar3 = bVar2;
    while (bVar3) {
      iVar1 = (sectorPortals.Array[uVar7].mDestination)->PortalGroup;
      iVar4 = this->Sector->PortalGroup;
      dVar9 = 0.0;
      dVar10 = 0.0;
      if (iVar4 != iVar1) {
        iVar4 = iVar1 * Displacements.size + iVar4;
        dVar9 = Displacements.data.Array[iVar4].pos.X;
        dVar10 = Displacements.data.Array[iVar4].pos.Y;
      }
      dVar11 = (this->__Pos).Z;
      dVar9 = dVar9 + (this->__Pos).X;
      dVar10 = dVar10 + (this->__Pos).Y;
      psVar5 = P_PointInSubsector(dVar9,dVar10);
      psVar6 = psVar5->sector;
      if ((psVar6->planes[1].Flags & 0x1d0U) != 0x100) break;
      uVar7 = (ulong)psVar6->Portals[1];
      bVar3 = sectorPortals.Array[uVar7].mPlaneZ <= dVar8;
    }
  }
  else {
    bVar2 = false;
  }
  __return_storage_ptr__->Z = dVar11;
  __return_storage_ptr__->Y = dVar10;
  __return_storage_ptr__->X = dVar9;
  if (!bVar2) {
    local_58 = __return_storage_ptr__->Z;
    local_48 = __return_storage_ptr__->X;
    local_50 = __return_storage_ptr__->Y;
    if ((psVar6->planes[0].Flags & 0x1d0U) == 0x100) {
      uVar7 = (ulong)psVar6->Portals[0];
      dVar9 = sectorPortals.Array[uVar7].mPlaneZ;
      while (dVar8 < dVar9) {
        iVar1 = (sectorPortals.Array[uVar7].mDestination)->PortalGroup;
        iVar4 = this->Sector->PortalGroup;
        local_48 = 0.0;
        local_50 = 0.0;
        if (iVar4 != iVar1) {
          iVar4 = iVar1 * Displacements.size + iVar4;
          local_48 = Displacements.data.Array[iVar4].pos.X;
          local_50 = Displacements.data.Array[iVar4].pos.Y;
        }
        local_58 = (this->__Pos).Z;
        local_48 = local_48 + (this->__Pos).X;
        local_50 = local_50 + (this->__Pos).Y;
        psVar5 = P_PointInSubsector(local_48,local_50);
        psVar6 = psVar5->sector;
        if ((psVar6->planes[0].Flags & 0x1d0U) != 0x100) break;
        uVar7 = (ulong)psVar6->Portals[0];
        dVar9 = sectorPortals.Array[uVar7].mPlaneZ;
      }
    }
    __return_storage_ptr__->Z = local_58;
    __return_storage_ptr__->Y = local_50;
    __return_storage_ptr__->X = local_48;
  }
  if (pSec != (sector_t **)0x0) {
    *pSec = (sector_t *)psVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

DVector3 AActor::GetPortalTransition(double byoffset, sector_t **pSec)
{
	bool moved = false;
	sector_t *sec = Sector;
	double testz = Z() + byoffset;
	DVector3 pos = Pos();

	while (!sec->PortalBlocksMovement(sector_t::ceiling))
	{
		if (testz >= sec->GetPortalPlaneZ(sector_t::ceiling))
		{
			pos = PosRelative(sec->GetOppositePortalGroup(sector_t::ceiling));
			sec = P_PointInSector(pos);
			moved = true;
		}
		else break;
	}
	if (!moved)
	{
		while (!sec->PortalBlocksMovement(sector_t::floor))
		{
			if (testz < sec->GetPortalPlaneZ(sector_t::floor))
			{
				pos = PosRelative(sec->GetOppositePortalGroup(sector_t::floor));
				sec = P_PointInSector(pos);
			}
			else break;
		}
	}
	if (pSec) *pSec = sec;
	return pos;
}